

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retinaface.cpp
# Opt level: O0

void draw_faceobjects(Mat *bgr,vector<FaceObject,_std::allocator<FaceObject>_> *faceobjects)

{
  ulong uVar1;
  size_type sVar2;
  vector<FaceObject,_std::allocator<FaceObject>_> *in_RSI;
  int y;
  int x;
  Size label_size;
  int baseLine;
  char text [256];
  FaceObject *obj;
  size_t i;
  Mat image;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  Mat *in_stack_fffffffffffffb78;
  _InputOutputArray *in_stack_fffffffffffffb80;
  allocator *paVar3;
  Rect_<float> *in_stack_fffffffffffffb88;
  Scalar_<double> *in_stack_fffffffffffffb90;
  _InputArray local_458;
  allocator local_439;
  string local_438 [32];
  undefined1 local_418 [36];
  Point_<int> local_3f4;
  undefined1 local_3e9 [33];
  undefined1 local_3c8 [24];
  undefined1 local_3b0 [32];
  Size_<int> local_390;
  Point_<int> local_388;
  Rect_<int> local_380;
  undefined1 local_370 [28];
  int local_354;
  int local_350;
  allocator local_349;
  string local_348 [36];
  int local_324;
  int local_320;
  int local_31c;
  Scalar_<double> local_318 [8];
  undefined1 local_218 [32];
  undefined1 local_1f8 [8];
  undefined1 local_1f0 [24];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [8];
  undefined1 local_1b0 [24];
  undefined1 local_198 [32];
  undefined1 local_178 [8];
  undefined1 local_170 [24];
  undefined1 local_158 [32];
  undefined1 local_138 [8];
  undefined1 local_130 [24];
  undefined1 local_118 [32];
  undefined1 local_f8 [8];
  undefined1 local_f0 [24];
  undefined1 local_d8 [36];
  undefined1 local_b4 [28];
  undefined1 local_98 [24];
  const_reference local_80;
  ulong local_78;
  Mat local_70 [12];
  int local_64;
  vector<FaceObject,_std::allocator<FaceObject>_> *local_10;
  
  local_10 = in_RSI;
  cv::Mat::clone();
  local_78 = 0;
  while( true ) {
    uVar1 = local_78;
    sVar2 = std::vector<FaceObject,_std::allocator<FaceObject>_>::size(local_10);
    if (sVar2 <= uVar1) break;
    local_80 = std::vector<FaceObject,_std::allocator<FaceObject>_>::operator[](local_10,local_78);
    fprintf(_stderr,"%.5f at %.2f %.2f %.2f x %.2f\n",(double)local_80->prob,
            (double)(local_80->rect).x,(double)(local_80->rect).y,(double)(local_80->rect).width,
            (double)(local_80->rect).height);
    cv::_InputOutputArray::_InputOutputArray(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    cv::Rect_::operator_cast_to_Rect_(in_stack_fffffffffffffb88);
    cv::Scalar_<double>::Scalar_
              (in_stack_fffffffffffffb90,(double)in_stack_fffffffffffffb88,
               (double)in_stack_fffffffffffffb80,(double)in_stack_fffffffffffffb78,
               (double)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    cv::rectangle(local_98,local_b4,local_d8,1,8,0);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x128eb4);
    cv::_InputOutputArray::_InputOutputArray(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    cv::Point_::operator_cast_to_Point_((Point_<float> *)in_stack_fffffffffffffb88);
    cv::Scalar_<double>::Scalar_
              (in_stack_fffffffffffffb90,(double)in_stack_fffffffffffffb88,
               (double)in_stack_fffffffffffffb80,(double)in_stack_fffffffffffffb78,
               (double)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    cv::circle(local_f0,local_f8,2,local_118,0xffffffff,8,0);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x128f4c);
    cv::_InputOutputArray::_InputOutputArray(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    cv::Point_::operator_cast_to_Point_((Point_<float> *)in_stack_fffffffffffffb88);
    cv::Scalar_<double>::Scalar_
              (in_stack_fffffffffffffb90,(double)in_stack_fffffffffffffb88,
               (double)in_stack_fffffffffffffb80,(double)in_stack_fffffffffffffb78,
               (double)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    cv::circle(local_130,local_138,2,local_158,0xffffffff,8,0);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x128fe4);
    cv::_InputOutputArray::_InputOutputArray(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    cv::Point_::operator_cast_to_Point_((Point_<float> *)in_stack_fffffffffffffb88);
    cv::Scalar_<double>::Scalar_
              (in_stack_fffffffffffffb90,(double)in_stack_fffffffffffffb88,
               (double)in_stack_fffffffffffffb80,(double)in_stack_fffffffffffffb78,
               (double)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    cv::circle(local_170,local_178,2,local_198,0xffffffff,8,0);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x12907c);
    cv::_InputOutputArray::_InputOutputArray(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    cv::Point_::operator_cast_to_Point_((Point_<float> *)in_stack_fffffffffffffb88);
    cv::Scalar_<double>::Scalar_
              (in_stack_fffffffffffffb90,(double)in_stack_fffffffffffffb88,
               (double)in_stack_fffffffffffffb80,(double)in_stack_fffffffffffffb78,
               (double)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    cv::circle(local_1b0,local_1b8,2,local_1d8,0xffffffff,8,0);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x129114);
    cv::_InputOutputArray::_InputOutputArray(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    cv::Point_::operator_cast_to_Point_((Point_<float> *)in_stack_fffffffffffffb88);
    cv::Scalar_<double>::Scalar_
              (in_stack_fffffffffffffb90,(double)in_stack_fffffffffffffb88,
               (double)in_stack_fffffffffffffb80,(double)in_stack_fffffffffffffb78,
               (double)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    cv::circle(local_1f0,local_1f8,2,local_218,0xffffffff,8,0);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x1291ac);
    in_stack_fffffffffffffb90 = local_318;
    sprintf((char *)in_stack_fffffffffffffb90,"%.1f%%",(double)(local_80->prob * 100.0));
    local_31c = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_348,(char *)in_stack_fffffffffffffb90,&local_349);
    cv::getTextSize((string *)&local_324,(int)local_348,0.5,0,(int *)0x1);
    std::__cxx11::string::~string(local_348);
    std::allocator<char>::~allocator((allocator<char> *)&local_349);
    local_350 = (int)(local_80->rect).x;
    local_354 = (int)(((local_80->rect).y - (float)local_320) - (float)local_31c);
    if (local_354 < 0) {
      local_354 = 0;
    }
    if (local_64 < local_350 + local_324) {
      local_350 = local_64 - local_324;
    }
    cv::_InputOutputArray::_InputOutputArray(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    cv::Point_<int>::Point_(&local_388,local_350,local_354);
    cv::Size_<int>::Size_(&local_390,local_324,local_320 + local_31c);
    cv::Rect_<int>::Rect_(&local_380,&local_388,&local_390);
    cv::Scalar_<double>::Scalar_
              (in_stack_fffffffffffffb90,(double)in_stack_fffffffffffffb88,
               (double)in_stack_fffffffffffffb80,(double)in_stack_fffffffffffffb78,
               (double)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    cv::rectangle(local_370,&local_380,local_3b0,0xffffffff,8,0);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x12950a);
    cv::_InputOutputArray::_InputOutputArray(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    in_stack_fffffffffffffb88 = (Rect_<float> *)local_3e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_3e9 + 1),(char *)local_318,(allocator *)in_stack_fffffffffffffb88);
    cv::Point_<int>::Point_(&local_3f4,local_350,local_354 + local_320);
    cv::Scalar_<double>::Scalar_
              (in_stack_fffffffffffffb90,(double)in_stack_fffffffffffffb88,
               (double)in_stack_fffffffffffffb80,(double)in_stack_fffffffffffffb78,
               (double)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    in_stack_fffffffffffffb70 = 0;
    in_stack_fffffffffffffb68 = 8;
    cv::putText(0x3fe0000000000000,local_3c8,local_3e9 + 1,&local_3f4,0,local_418);
    std::__cxx11::string::~string((string *)(local_3e9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_3e9);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x1295fe);
    local_78 = local_78 + 1;
  }
  paVar3 = &local_439;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"image",paVar3);
  cv::_InputArray::_InputArray
            ((_InputArray *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
             (Mat *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  cv::imshow(local_438,&local_458);
  cv::_InputArray::~_InputArray(&local_458);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  cv::waitKey(0);
  cv::Mat::~Mat(local_70);
  return;
}

Assistant:

static void draw_faceobjects(const cv::Mat& bgr, const std::vector<FaceObject>& faceobjects)
{
    cv::Mat image = bgr.clone();

    for (size_t i = 0; i < faceobjects.size(); i++)
    {
        const FaceObject& obj = faceobjects[i];

        fprintf(stderr, "%.5f at %.2f %.2f %.2f x %.2f\n", obj.prob,
                obj.rect.x, obj.rect.y, obj.rect.width, obj.rect.height);

        cv::rectangle(image, obj.rect, cv::Scalar(0, 255, 0));

        cv::circle(image, obj.landmark[0], 2, cv::Scalar(0, 255, 255), -1);
        cv::circle(image, obj.landmark[1], 2, cv::Scalar(0, 255, 255), -1);
        cv::circle(image, obj.landmark[2], 2, cv::Scalar(0, 255, 255), -1);
        cv::circle(image, obj.landmark[3], 2, cv::Scalar(0, 255, 255), -1);
        cv::circle(image, obj.landmark[4], 2, cv::Scalar(0, 255, 255), -1);

        char text[256];
        sprintf(text, "%.1f%%", obj.prob * 100);

        int baseLine = 0;
        cv::Size label_size = cv::getTextSize(text, cv::FONT_HERSHEY_SIMPLEX, 0.5, 1, &baseLine);

        int x = obj.rect.x;
        int y = obj.rect.y - label_size.height - baseLine;
        if (y < 0)
            y = 0;
        if (x + label_size.width > image.cols)
            x = image.cols - label_size.width;

        cv::rectangle(image, cv::Rect(cv::Point(x, y), cv::Size(label_size.width, label_size.height + baseLine)),
                      cv::Scalar(255, 255, 255), -1);

        cv::putText(image, text, cv::Point(x, y + label_size.height),
                    cv::FONT_HERSHEY_SIMPLEX, 0.5, cv::Scalar(0, 0, 0));
    }

    cv::imshow("image", image);
    cv::waitKey(0);
}